

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

pair<void_*,_void_*> __thiscall
poly::
vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
::destroy_range(vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
                *this,elem_ptr_pointer first,elem_ptr_pointer last)

{
  pair<void_*,_void_*> pVar1;
  elem_ptr_pointer pvVar2;
  my_base *this_00;
  void_pointer local_48;
  elem_ptr_pointer last_local;
  elem_ptr_pointer first_local;
  vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
  *this_local;
  pair<void_*,_void_*> ret;
  
  std::pair<void_*,_void_*>::pair<void_*,_void_*,_true>((pair<void_*,_void_*> *)&this_local);
  last_local = first;
  if (first != last) {
    this_local = (vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
                  *)(first->ptr).first;
    pvVar2 = end_elem(this);
    if (last == pvVar2) {
      this_00 = base(this);
      local_48 = vector_impl::
                 allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
                 ::end_storage(this_00);
    }
    else {
      local_48 = (last->ptr).first;
    }
    ret.first = local_48;
  }
  for (; last_local != last; last_local = last_local + 1) {
    destroy_elem(this,last_local);
  }
  pVar1.second = ret.first;
  pVar1.first = this_local;
  return pVar1;
}

Assistant:

inline auto vector<I, A, C>::destroy_range(elem_ptr_pointer first, elem_ptr_pointer last) noexcept
    -> std::pair<void_pointer, void_pointer>
{
    std::pair<void_pointer, void_pointer> ret {};
    if (first != last) {
        ret.first  = first->ptr.first;
        ret.second = last != end_elem() ? last->ptr.first : base().end_storage();
    }
    for (; first != last; ++first) {
        destroy_elem(first);
    }
    return ret;
}